

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O2

void __thiscall
ConfidentialTransactionContext_PeginSequence_Test::TestBody
          (ConfidentialTransactionContext_PeginSequence_Test *this)

{
  bool bVar1;
  initializer_list<cfd::UtxoData> __l;
  allocator local_b5a;
  allocator local_b59;
  AssertionResult gtest_ar;
  OutPoint outpoint1;
  string local_af8;
  string local_ad8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_ab8;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  SigHashType local_a84;
  Privkey key;
  ElementsAddressFactory factory;
  Transaction btc_tx;
  ConfidentialTransactionContext txc;
  UtxoData utxo1;
  
  cfd::ElementsAddressFactory::ElementsAddressFactory(&factory,kElementsRegtest);
  std::__cxx11::string::string
            ((string *)&utxo1,
             "020000000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff010cdff5050000000017a91426b9ba9cf5d822b70cf490ad0394566f9db20c63870247304402200b3ca71e82551a333fe5c8ce9a8f8454eb8f08aa194180e5a87c79ccf2e46212022065c1f2a363ebcb155a80e234258394140d08f6ab807581953bb21a58f2d229a6012102fd54c734e48c544c3c3ad1aab0607f896eb95e23e7058b174a580826a7940ad800000000"
             ,(allocator *)&txc);
  cfd::core::Transaction::Transaction(&btc_tx,(string *)&utxo1);
  std::__cxx11::string::~string((string *)&utxo1);
  cfd::UtxoData::UtxoData(&utxo1);
  utxo1.block_height = 0;
  cfd::core::AbstractTransaction::GetTxid((Txid *)&txc,&btc_tx.super_AbstractTransaction);
  cfd::core::Txid::operator=(&utxo1.txid,(Txid *)&txc);
  cfd::core::Txid::~Txid((Txid *)&txc);
  utxo1.vout = 0;
  std::__cxx11::string::assign((char *)&utxo1.descriptor);
  cfd::core::Amount::Amount((Amount *)&txc,0x5f5df0c);
  utxo1.amount.ignore_check_ =
       (bool)txc.super_ConfidentialTransaction.super_AbstractTransaction.wally_tx_pointer_._0_1_;
  utxo1.amount.amount_ =
       (int64_t)txc.super_ConfidentialTransaction.super_AbstractTransaction.
                _vptr_AbstractTransaction;
  std::__cxx11::string::string
            ((string *)&outpoint1,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,(allocator *)&gtest_ar);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&txc,(string *)&outpoint1);
  cfd::core::ConfidentialAssetId::operator=(&utxo1.asset,(ConfidentialAssetId *)&txc);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&txc);
  std::__cxx11::string::~string((string *)&outpoint1);
  cfd::UtxoData::UtxoData((UtxoData *)&txc,&utxo1);
  __l._M_len = 1;
  __l._M_array = (iterator)&txc;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (&utxos,__l,(allocator_type *)&outpoint1);
  cfd::UtxoData::~UtxoData((UtxoData *)&txc);
  std::__cxx11::string::string
            ((string *)&outpoint1,
             "0200000001017b9c531679cc8b8310338e350dbfd89bbfaf19fd227e3d1a69f8baf0088570120000004000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000005f5db2402fe5ec67a3f8f932a9c7b987e501f105362630fc2576d5174506dde5a94902dd7160014a7b2b1da77ffa99d565b00d9f7b1c2e44a6907a80125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000003e800000000000000000006080cdff505000000002025b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f160014e794713e386d83f32baa0e9d03e47c0839dc57a8c0020000000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff010cdff5050000000017a91426b9ba9cf5d822b70cf490ad0394566f9db20c63870247304402200b3ca71e82551a333fe5c8ce9a8f8454eb8f08aa194180e5a87c79ccf2e46212022065c1f2a363ebcb155a80e234258394140d08f6ab807581953bb21a58f2d229a6012102fd54c734e48c544c3c3ad1aab0607f896eb95e23e7058b174a580826a7940ad8000000009700000020fe3b574c1ce6d5cb68fc518e86f7976e599fafc0a2e5754aace7ca16d97a7c78ef9325b8d4f0a4921e060fc5e71435f46a18fa339688142cd4b028c8488c9f8dd1495b5dffff7f200200000002000000024a180a6822abffc3b1080c49016899c6dac25083936df14af12f58db11958ef27926299350fdc2f4d0da1d4f0fbbd3789d29f9dc016358ae42463c0cebf393f3010500000000"
             ,(allocator *)&gtest_ar);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&txc,(string *)&outpoint1);
  std::__cxx11::string::~string((string *)&outpoint1);
  cfd::core::Privkey::GenerageRandomKey();
  cfd::core::Amount::Amount((Amount *)&local_ab8,0);
  std::__cxx11::string::string((string *)&local_ad8,"6a",&local_b5a);
  cfd::core::Script::Script((Script *)&outpoint1,&local_ad8);
  cfd::core::Privkey::GetPubkey((Pubkey *)&local_af8,&key);
  cfd::core::ConfidentialNonce::ConfidentialNonce
            ((ConfidentialNonce *)&gtest_ar,(Pubkey *)&local_af8);
  cfd::core::ConfidentialTransaction::AddTxOut
            (&txc.super_ConfidentialTransaction,(Amount *)&local_ab8,&utxo1.asset,
             (Script *)&outpoint1,(ConfidentialNonce *)&gtest_ar);
  cfd::core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_af8);
  cfd::core::Script::~Script((Script *)&outpoint1);
  std::__cxx11::string::~string((string *)&local_ad8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::CollectInputUtxo(&txc,&utxos);
    }
  }
  else {
    testing::Message::Message((Message *)&outpoint1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x3ec,
               "Expected: txc.CollectInputUtxo(utxos) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&outpoint1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&outpoint1);
  }
  cfd::ConfidentialTransactionContext::Blind
            (&txc,(vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
                   *)0x0,1,0,0x34,
             (vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_> *)0x0);
  cfd::core::OutPoint::OutPoint(&outpoint1,&utxo1.txid,utxo1.vout);
  std::__cxx11::string::string
            ((string *)&gtest_ar,
             "02e053cd67c379c3f1a2c4dfcf8e11495510f59d1da814a4172d205088ab7ee5d3",&local_b5a);
  cfd::core::Pubkey::Pubkey((Pubkey *)&local_ab8,(string *)&gtest_ar);
  std::__cxx11::string::string
            ((string *)&local_af8,"cUfipPioYnHU61pfYTH9uuNoswRXx8rtzXhJZrsPeVV1LRFdTxvp",&local_b59)
  ;
  cfd::core::Privkey::FromWif((Privkey *)&local_ad8,&local_af8,kTestnet,true);
  cfd::core::SigHashType::SigHashType(&local_a84);
  cfd::ConfidentialTransactionContext::SignWithKey
            (&txc,&outpoint1,(Pubkey *)&local_ab8,(Privkey *)&local_ad8,&local_a84,true);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_ad8);
  std::__cxx11::string::~string((string *)&local_af8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_ab8);
  std::__cxx11::string::~string((string *)&gtest_ar);
  cfd::ConfidentialTransactionContext::Verify(&txc,&outpoint1);
  cfd::core::Txid::~Txid(&outpoint1.txid_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&txc);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&utxos);
  cfd::UtxoData::~UtxoData(&utxo1);
  cfd::core::Transaction::~Transaction(&btc_tx);
  cfd::AddressFactory::~AddressFactory(&factory.super_AddressFactory);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, PeginSequence)
{
  ElementsAddressFactory factory(NetType::kElementsRegtest);

  Transaction btc_tx("020000000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff010cdff5050000000017a91426b9ba9cf5d822b70cf490ad0394566f9db20c63870247304402200b3ca71e82551a333fe5c8ce9a8f8454eb8f08aa194180e5a87c79ccf2e46212022065c1f2a363ebcb155a80e234258394140d08f6ab807581953bb21a58f2d229a6012102fd54c734e48c544c3c3ad1aab0607f896eb95e23e7058b174a580826a7940ad800000000");

  // Address1 (p2wpkh)
  // pubkey: '02e053cd67c379c3f1a2c4dfcf8e11495510f59d1da814a4172d205088ab7ee5d3',
  // privkey: 'cUfipPioYnHU61pfYTH9uuNoswRXx8rtzXhJZrsPeVV1LRFdTxvp'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.txid = btc_tx.GetTxid();
  utxo1.vout = 0;
  utxo1.descriptor = "wpkh(02e053cd67c379c3f1a2c4dfcf8e11495510f59d1da814a4172d205088ab7ee5d3)";
  utxo1.amount = Amount(int64_t{99999500});
  utxo1.asset = ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
  // utxo1.locking_script = Script("0014e794713e386d83f32baa0e9d03e47c0839dc57a8");
  // utxo1.redeem_script;
  // utxo1.address = factory.GetAddress("ert1qu728z03cdkplx2a2p6ws8erupquac4ag9xjpx6");
  // utxo1.address_type = AddressType::kP2wpkhAddress;

  std::vector<cfd::UtxoData> utxos{utxo1};
  ConfidentialTransactionContext txc("0200000001017b9c531679cc8b8310338e350dbfd89bbfaf19fd227e3d1a69f8baf0088570120000004000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000005f5db2402fe5ec67a3f8f932a9c7b987e501f105362630fc2576d5174506dde5a94902dd7160014a7b2b1da77ffa99d565b00d9f7b1c2e44a6907a80125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000003e800000000000000000006080cdff505000000002025b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f160014e794713e386d83f32baa0e9d03e47c0839dc57a8c0020000000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff010cdff5050000000017a91426b9ba9cf5d822b70cf490ad0394566f9db20c63870247304402200b3ca71e82551a333fe5c8ce9a8f8454eb8f08aa194180e5a87c79ccf2e46212022065c1f2a363ebcb155a80e234258394140d08f6ab807581953bb21a58f2d229a6012102fd54c734e48c544c3c3ad1aab0607f896eb95e23e7058b174a580826a7940ad8000000009700000020fe3b574c1ce6d5cb68fc518e86f7976e599fafc0a2e5754aace7ca16d97a7c78ef9325b8d4f0a4921e060fc5e71435f46a18fa339688142cd4b028c8488c9f8dd1495b5dffff7f200200000002000000024a180a6822abffc3b1080c49016899c6dac25083936df14af12f58db11958ef27926299350fdc2f4d0da1d4f0fbbd3789d29f9dc016358ae42463c0cebf393f3010500000000");

  auto key = Privkey::GenerageRandomKey();
  txc.AddTxOut(Amount(0), utxo1.asset, Script("6a"), ConfidentialNonce(key.GetPubkey()));

  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));
  txc.Blind();

  // sign1
  OutPoint outpoint1(utxo1.txid, utxo1.vout);
  try {
    txc.SignWithKey(outpoint1,
      Pubkey("02e053cd67c379c3f1a2c4dfcf8e11495510f59d1da814a4172d205088ab7ee5d3"),
      Privkey::FromWif(
          "cUfipPioYnHU61pfYTH9uuNoswRXx8rtzXhJZrsPeVV1LRFdTxvp", NetType::kTestnet));

    txc.Verify(outpoint1);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }
}